

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<Finite> __thiscall Matrix<Finite>::operator/(Matrix<Finite> *this,Finite *a)

{
  Matrix<Finite> *in_RDX;
  Finite *extraout_RDX;
  Finite *in_RDI;
  Matrix<Finite> MVar1;
  Matrix<Finite> *unaff_retaddr;
  Matrix<Finite> temp;
  Finite *in_stack_ffffffffffffff88;
  Finite *this_00;
  Matrix<Finite> *in_stack_ffffffffffffffa8;
  Matrix<Finite> *in_stack_ffffffffffffffb0;
  Finite *a_00;
  
  this_00 = in_RDI;
  a_00 = in_RDI;
  Matrix(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Finite::Finite(this_00,in_stack_ffffffffffffff88);
  operator/=(unaff_retaddr,a_00);
  Matrix(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Finite::~Finite((Finite *)0x1602b4);
  ~Matrix(in_RDX);
  MVar1.arr = extraout_RDX;
  MVar1._0_8_ = in_RDI;
  return MVar1;
}

Assistant:

inline const Matrix operator/(Field a) const
    {
        Matrix temp(*this);
        return temp /= a;
    }